

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_t_impl.hpp
# Opt level: O0

ostream * toml::operator<<(ostream *os,value_t t)

{
  undefined1 in_SIL;
  ostream *in_RDI;
  
  switch(in_SIL) {
  case 0:
    std::operator<<(in_RDI,"empty");
    break;
  case 1:
    std::operator<<(in_RDI,"boolean");
    break;
  case 2:
    std::operator<<(in_RDI,"integer");
    break;
  case 3:
    std::operator<<(in_RDI,"floating");
    break;
  case 4:
    std::operator<<(in_RDI,"string");
    break;
  case 5:
    std::operator<<(in_RDI,"offset_datetime");
    break;
  case 6:
    std::operator<<(in_RDI,"local_datetime");
    break;
  case 7:
    std::operator<<(in_RDI,"local_date");
    break;
  case 8:
    std::operator<<(in_RDI,"local_time");
    break;
  case 9:
    std::operator<<(in_RDI,"array");
    break;
  case 10:
    std::operator<<(in_RDI,"table");
    break;
  default:
    std::operator<<(in_RDI,"unknown");
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, value_t t)
{
    switch(t)
    {
        case value_t::boolean         : os << "boolean";         return os;
        case value_t::integer         : os << "integer";         return os;
        case value_t::floating        : os << "floating";        return os;
        case value_t::string          : os << "string";          return os;
        case value_t::offset_datetime : os << "offset_datetime"; return os;
        case value_t::local_datetime  : os << "local_datetime";  return os;
        case value_t::local_date      : os << "local_date";      return os;
        case value_t::local_time      : os << "local_time";      return os;
        case value_t::array           : os << "array";           return os;
        case value_t::table           : os << "table";           return os;
        case value_t::empty           : os << "empty";           return os;
        default                       : os << "unknown";         return os;
    }
}